

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O0

void __thiscall pcap_reader::pcap_reader(pcap_reader *this)

{
  pcap_reader *this_local;
  
  this->is_wrong_endian = false;
  this->buffer_size = 0;
  this->buffer = (uint8_t *)0x0;
  this->ip_offset = 0;
  this->ip_version = 0;
  this->tp_length = 0;
  this->tp_offset = 0;
  this->tp_version = 0;
  this->tp_port1 = 0;
  this->tp_port2 = 0;
  this->is_fragment = false;
  this->fragment_length = 0;
  this->F_pcap = (FILE *)0x0;
  this->F_extract = (FILE *)0x0;
  memset(&this->header,0,0x18);
  memset(&this->frame_header,0,0x10);
  return;
}

Assistant:

pcap_reader::pcap_reader()
    :
    is_wrong_endian(false),
    buffer_size(0),
    buffer (NULL),
    ip_offset(0),
    ip_version (0),
    tp_length(0),
    tp_offset(0),
    tp_version(0),
    tp_port1(0),
    tp_port2(0),
    is_fragment(false),
    fragment_length(0),
    F_pcap(NULL),
    F_extract(NULL)
{
    memset(&header, 0, sizeof(header));
    memset(&frame_header, 0, sizeof(frame_header));
}